

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateInstallNameFixup
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *evaluatedRPaths,string *filename,string *depName,Indent indent)

{
  char *pcVar1;
  cmMakefile *this_00;
  pointer pbVar2;
  int iVar3;
  cmInstallRuntimeDependencySetGenerator *this_01;
  size_t sVar4;
  ostream *poVar5;
  string *psVar6;
  WrapQuotes wrapQuotes;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rpath;
  pointer pbVar8;
  Indent IVar9;
  string_view str;
  string local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  string *local_88;
  cmInstallRuntimeDependencySetGenerator *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  wrapQuotes = (WrapQuotes)filename;
  if ((this->NoInstallRPath != true) || (this->NoInstallName == false)) {
    iVar3 = (int)os;
    IVar9.Level = indent.Level;
    local_90 = evaluatedRPaths;
    local_88 = depName;
    local_78 = config;
    if (((evaluatedRPaths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start ==
         (evaluatedRPaths->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) && (this->NoInstallName == true)) {
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          IVar9.Level = IVar9.Level + -1;
        } while (IVar9.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      pcVar1 = this->RPathPrefix;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar4);
      }
      IVar9.Level = indent.Level + 2;
      std::__ostream_insert<char,std::char_traits<char>>(os,"_",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
    }
    iVar7 = IVar9.Level;
    if (0 < IVar9.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set(",4);
    pcVar1 = this->TmpVarPrefix;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"_rpath_args)\n",0xd);
    if (this->NoInstallRPath == false) {
      iVar7 = IVar9.Level;
      if (0 < IVar9.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"foreach(",8);
      pcVar1 = this->TmpVarPrefix;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"_rpath IN LISTS ",0x10);
      pcVar1 = this->RPathPrefix;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar4);
      }
      local_b0._M_dataplus._M_p._0_1_ = 0x5f;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_b0,1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(filename->_M_dataplus)._M_p,filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
      if (-2 < IVar9.Level) {
        iVar7 = IVar9.Level + 2;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"list(APPEND ",0xc);
      pcVar1 = this->TmpVarPrefix;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"_rpath_args -delete_rpath \"${",0x1d);
      pcVar1 = this->TmpVarPrefix;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_rpath}\")\n",10);
      iVar7 = IVar9.Level;
      if (0 < IVar9.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"endforeach()\n",0xd);
    }
    iVar7 = IVar9.Level;
    if (0 < IVar9.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
    this_00 = this->LocalGenerator->Makefile;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"CMAKE_INSTALL_NAME_TOOL","");
    psVar6 = cmMakefile::GetSafeDefinition(this_00,&local_b0);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ${",4);
    pcVar1 = this->TmpVarPrefix;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar4 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar1,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_rpath_args}\n",0xd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_80 = this;
    if (this->NoInstallRPath == false) {
      pbVar2 = (local_90->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (local_90->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2;
          pbVar8 = pbVar8 + 1) {
        iVar7 = IVar9.Level;
        if (0 < IVar9.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  -add_rpath ",0xd);
        str._M_str = (char *)0x0;
        str._M_len = (size_t)(pbVar8->_M_dataplus)._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_b0,(cmOutputConverter *)pbVar8->_M_string_length,str,wrapQuotes);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
    }
    this_01 = local_80;
    if (local_80->NoInstallName == false) {
      iVar7 = IVar9.Level;
      if (0 < IVar9.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"  -id \"${",9);
      pcVar1 = this_01->TmpVarPrefix;
      if (pcVar1 == (char *)0x0) {
        std::ios::clear(iVar3 + (int)os->_vptr_basic_ostream[-3]);
      }
      else {
        sVar4 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar1,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"_install_name_dir}",0x12);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(local_88->_M_dataplus)._M_p,local_88->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    }
    if (0 < IVar9.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar9.Level = IVar9.Level + -1;
      } while (IVar9.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
    GetDestination(&local_50,this_01,local_78);
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_70,&local_50);
    cmInstallGenerator::GetDestDirPath(&local_b0,&local_70);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(local_88->_M_dataplus)._M_p,local_88->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (((local_90->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start ==
         (local_90->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish) && (this_01->NoInstallName == true)) {
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          indent.Level = indent.Level + -1;
        } while (indent.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    }
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateInstallNameFixup(
  std::ostream& os, const std::string& config,
  const std::vector<std::string>& evaluatedRPaths, const std::string& filename,
  const std::string& depName, Indent indent)
{
  if (!(this->NoInstallRPath && this->NoInstallName)) {
    auto indent2 = indent;
    if (evaluatedRPaths.empty() && this->NoInstallName) {
      indent2 = indent2.Next();
      os << indent << "if(" << this->RPathPrefix << "_" << filename << ")\n";
    }
    os << indent2 << "set(" << this->TmpVarPrefix << "_rpath_args)\n";
    if (!this->NoInstallRPath) {
      os << indent2 << "foreach(" << this->TmpVarPrefix << "_rpath IN LISTS "
         << this->RPathPrefix << '_' << filename << ")\n"
         << indent2.Next() << "list(APPEND " << this->TmpVarPrefix
         << "_rpath_args -delete_rpath \"${" << this->TmpVarPrefix
         << "_rpath}\")\n"
         << indent2 << "endforeach()\n";
    }
    os << indent2 << "execute_process(COMMAND \""
       << this->LocalGenerator->GetMakefile()->GetSafeDefinition(
            "CMAKE_INSTALL_NAME_TOOL")
       << "\" ${" << this->TmpVarPrefix << "_rpath_args}\n";
    if (!this->NoInstallRPath) {
      for (auto const& rpath : evaluatedRPaths) {
        os << indent2 << "  -add_rpath "
           << cmOutputConverter::EscapeForCMake(rpath) << "\n";
      }
    }
    if (!this->NoInstallName) {
      os << indent2 << "  -id \"${" << this->TmpVarPrefix
         << "_install_name_dir}" << depName << "\"\n";
    }
    os << indent2 << "  \""
       << GetDestDirPath(
            ConvertToAbsoluteDestination(this->GetDestination(config)))
       << "/" << depName << "\")\n";
    if (evaluatedRPaths.empty() && this->NoInstallName) {
      os << indent << "endif()\n";
    }
  }
}